

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

string_t __thiscall
duckdb::SubstringGrapheme(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  duckdb *pdVar1;
  long lVar2;
  duckdb *pdVar3;
  duckdb *input_size;
  long offset_00;
  duckdb *pdVar4;
  char *input_data;
  duckdb *unaff_R13;
  int64_t length_00;
  duckdb *pdVar5;
  bool bVar6;
  GraphemeIterator GVar7;
  GraphemeCluster GVar8;
  anon_union_16_2_67f50693_for_value aVar9;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  duckdb *local_88;
  GraphemeClusterIterator local_80;
  GraphemeClusterIterator local_60;
  undefined8 local_40;
  char *local_38;
  
  offset_00 = input.value._8_8_;
  local_38 = input.value._0_8_;
  input_size = (duckdb *)((ulong)result & 0xffffffff);
  input_data = local_38;
  if (input_size < (duckdb *)0xd) {
    input_data = (char *)((long)&local_40 + 4);
  }
  local_40 = result;
  AssertInSupportedRange((idx_t)input_size,offset_00,offset);
  if (offset == 0) {
    bVar6 = false;
    local_88 = this;
  }
  else {
    lVar2 = offset;
    if (offset_00 < 1) {
      if (offset_00 < 0) {
        pdVar3 = (duckdb *)0x0;
        if (0 < (long)(input_size + offset_00)) {
          pdVar3 = input_size + offset_00;
        }
      }
      else {
        local_88 = (duckdb *)0x0;
        if (offset < 2) {
          bVar6 = false;
          goto LAB_014e8a57;
        }
        lVar2 = offset + -1;
        pdVar3 = local_88;
      }
    }
    else {
      pdVar3 = (duckdb *)(offset_00 - 1U);
      if ((long)input_size < (long)(offset_00 - 1U)) {
        pdVar3 = input_size;
      }
    }
    pdVar4 = pdVar3 + lVar2;
    if (lVar2 < 1) {
      local_88 = (duckdb *)0x0;
      unaff_R13 = pdVar3;
      if (0 < (long)pdVar4) {
        local_88 = pdVar4;
      }
    }
    else {
      local_88 = pdVar3;
      unaff_R13 = pdVar4;
      if ((long)input_size < (long)pdVar4) {
        unaff_R13 = input_size;
      }
    }
    bVar6 = local_88 != unaff_R13;
  }
LAB_014e8a57:
  if (!bVar6) {
    aVar9.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
  }
  pdVar3 = unaff_R13 + 1;
  if (input_size <= unaff_R13 + 1) {
    pdVar3 = input_size;
  }
  if (pdVar3 != (duckdb *)0x0) {
    pdVar4 = (duckdb *)0x0;
    do {
      if (input_data[(long)pdVar4] < '\0') {
        pdVar3 = local_88;
        if ((offset_00 < 0) &&
           (pdVar4 = (duckdb *)Utf8Proc::GraphemeCount(input_data,(size_t)input_size), offset != 0))
        {
          pdVar5 = (duckdb *)0x0;
          if (0 < (long)(pdVar4 + offset_00)) {
            pdVar5 = pdVar4 + offset_00;
          }
          pdVar1 = pdVar5 + offset;
          if (offset < 1) {
            pdVar3 = (duckdb *)0x0;
            unaff_R13 = pdVar5;
            if (0 < (long)pdVar1) {
              pdVar3 = pdVar1;
            }
          }
          else {
            pdVar3 = pdVar5;
            unaff_R13 = pdVar1;
            if ((long)pdVar4 < (long)pdVar1) {
              unaff_R13 = pdVar4;
            }
          }
        }
        GVar7 = Utf8Proc::GraphemeClusters(input_data,(size_t)input_size);
        GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator
                  (&local_60,GVar7.s,GVar7.len);
        GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_80,(char *)0x0,0);
        bVar6 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_60,&local_80);
        if (bVar6) {
          local_88 = (duckdb *)0xffffffffffffffff;
          pdVar5 = (duckdb *)0x0;
          pdVar4 = input_size;
          goto LAB_014e8afe;
        }
        local_88 = (duckdb *)0xffffffffffffffff;
        goto LAB_014e8b5e;
      }
      pdVar4 = pdVar4 + 1;
    } while (pdVar3 != pdVar4);
  }
  length_00 = (long)unaff_R13 - (long)local_88;
LAB_014e8b77:
  aVar9.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       SubstringSlice((Vector *)this,input_data,(int64_t)local_88,length_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
  while( true ) {
    GraphemeIterator::GraphemeClusterIterator::operator++(&local_60);
    bVar6 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_60,&local_80);
    pdVar4 = input_size;
    if (!bVar6) break;
LAB_014e8afe:
    GVar8 = GraphemeIterator::GraphemeClusterIterator::operator*(&local_60);
    input_size = (duckdb *)GVar8.start;
    pdVar1 = input_size;
    if ((pdVar5 == pdVar3) || (pdVar1 = local_88, pdVar5 != unaff_R13)) {
      local_88 = pdVar1;
      pdVar5 = pdVar5 + 1;
      bVar6 = true;
      input_size = pdVar4;
    }
    else {
      bVar6 = false;
    }
    if (!bVar6) break;
  }
LAB_014e8b5e:
  if (local_88 == (duckdb *)0xffffffffffffffff) {
    aVar9.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
    return (string_t)aVar9;
  }
  length_00 = (long)input_size - (long)local_88;
  goto LAB_014e8b77;
}

Assistant:

string_t SubstringGrapheme(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	// we don't know yet if the substring is ascii, but we assume it is (for now)
	// first get the start and end as if this was an ascii string
	int64_t start, end;
	if (!SubstringStartEnd(UnsafeNumericCast<int64_t>(input_size), offset, length, start, end)) {
		return SubstringEmptyString(result);
	}

	// now check if all the characters between 0 and end are ascii characters
	// note that we scan one further to check for a potential combining diacritics (e.g. i + diacritic is ï)
	bool is_ascii = true;
	idx_t ascii_end = MinValue<idx_t>(UnsafeNumericCast<idx_t>(end + 1), input_size);
	for (idx_t i = 0; i < ascii_end; i++) {
		if (input_data[i] & 0x80) {
			// found a non-ascii character: eek
			is_ascii = false;
			break;
		}
	}
	if (is_ascii) {
		// all characters are ascii, we can just slice the substring
		return SubstringSlice(result, input_data, start, end - start);
	}
	// if the characters are not ascii, we need to scan grapheme clusters
	// first figure out which direction we need to scan
	// offset = 0 case is taken care of in SubstringStartEnd
	if (offset < 0) {
		// negative offset, this case is more difficult
		// we first need to count the number of characters in the string
		idx_t num_characters = Utf8Proc::GraphemeCount(input_data, input_size);
		// now call substring start and end again, but with the number of unicode characters this time
		SubstringStartEnd(UnsafeNumericCast<int64_t>(num_characters), offset, length, start, end);
	}

	// now scan the graphemes of the string to find the positions of the start and end characters
	int64_t current_character = 0;
	idx_t start_pos = DConstants::INVALID_INDEX, end_pos = input_size;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		if (current_character == start) {
			start_pos = cluster.start;
		} else if (current_character == end) {
			end_pos = cluster.start;
			break;
		}
		current_character++;
	}
	if (start_pos == DConstants::INVALID_INDEX) {
		return SubstringEmptyString(result);
	}
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}